

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

int __thiscall PP_Expression::shift_expression(PP_Expression *this)

{
  Token TVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = additive_expression(this);
  lVar4 = (this->super_Parser).index;
  if (lVar4 < (this->super_Parser).symbols.d.size) {
    (this->super_Parser).index = lVar4 + 1;
    TVar1 = (this->super_Parser).symbols.d.ptr[lVar4].token;
    if (TVar1 == LTLT) {
      iVar3 = shift_expression(this);
      return iVar2 << ((byte)iVar3 & 0x1f);
    }
    lVar4 = lVar4 + 1;
    if (TVar1 == GTGT) {
      iVar3 = shift_expression(this);
      return iVar2 >> ((byte)iVar3 & 0x1f);
    }
  }
  (this->super_Parser).index = lVar4 + -1;
  return iVar2;
}

Assistant:

int PP_Expression::shift_expression()
{
    int value = additive_expression();
    switch (next()) {
    case PP_LTLT:
        return value << shift_expression();
    case PP_GTGT:
        return value >> shift_expression();
    default:
        prev();
        return value;
    }
}